

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void MOJOSHADER_runPreshader(MOJOSHADER_preshader *preshader,float *outregs)

{
  double dVar1;
  uint uVar2;
  float *pfVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  undefined1 *__s;
  double dVar8;
  undefined8 uStack_180;
  undefined1 auStack_178 [8];
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  ulong local_140;
  ulong local_138;
  bool local_129;
  double local_128;
  double final;
  int i;
  int cpy_1;
  int cpy;
  int arrIndex;
  int *regsi;
  int i_1;
  uint index;
  int isscalar;
  int elemiter;
  int opiter;
  int isscalarop;
  int elemsbytes;
  int elems;
  MOJOSHADER_preshaderOperand *operand;
  MOJOSHADER_preshaderInstruction *pMStack_d8;
  int instit;
  MOJOSHADER_preshaderInstruction *inst;
  double *src2;
  double *src1;
  double *src0;
  double src [3] [4];
  double dst [4];
  undefined1 *local_30;
  double *temps;
  int scalarstart;
  float *inregs;
  float *outregs_local;
  MOJOSHADER_preshader *preshader_local;
  
  __s = auStack_178;
  pfVar3 = preshader->registers;
  local_30 = (undefined1 *)0x0;
  if (preshader->temp_count != 0) {
    lVar6 = -((ulong)preshader->temp_count * 8 + 0xf & 0xfffffffffffffff0);
    __s = auStack_178 + lVar6;
    uVar2 = preshader->temp_count;
    *(undefined8 *)((long)&uStack_180 + lVar6) = 0x1309f0;
    memset(__s,0,(ulong)uVar2 << 3);
    local_30 = __s;
  }
  *(undefined8 *)(__s + -8) = 0x130a00;
  memset(src[2] + 3,0,0x20);
  *(undefined8 *)(__s + -8) = 0x130a13;
  memset(&src0,0,0x60);
  src1 = (double *)&src0;
  src2 = src[0] + 3;
  inst = (MOJOSHADER_preshaderInstruction *)(src[1] + 3);
  pMStack_d8 = preshader->instructions;
  operand._4_4_ = 0;
  while( true ) {
    if (preshader->instruction_count <= operand._4_4_) {
      return;
    }
    _elemsbytes = pMStack_d8->operands;
    isscalarop = pMStack_d8->element_count;
    opiter = isscalarop << 3;
    elemiter = (int)(MOJOSHADER_PRESHADEROP_NOISE < pMStack_d8->opcode);
    if (isscalarop < 0) break;
    if (4 < isscalarop) {
      *(undefined8 *)(__s + -8) = 0x130b10;
      __assert_fail("elems <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x32,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
    }
    for (isscalar = 0; (uint)isscalar < pMStack_d8->operand_count - 1; isscalar = isscalar + 1) {
      local_129 = elemiter != 0 && isscalar == 0;
      i_1 = (int)local_129;
      regsi._4_4_ = _elemsbytes->index;
      local_138 = (ulong)_elemsbytes->type;
      switch(local_138) {
      case 0:
        if (_elemsbytes->array_register_count == 0) {
          if (i_1 == 0) {
            for (i = 0; i < isscalarop; i = i + 1) {
              src[(long)isscalar + -1][(long)i + 3] = (double)pfVar3[regsi._4_4_ + i];
            }
          }
          else {
            src[(long)isscalar + -1][3] = (double)pfVar3[regsi._4_4_];
          }
        }
        else {
          cpy_1 = (int)pfVar3[(regsi._4_4_ >> 4) * 4 + (regsi._4_4_ >> 2 & 3)];
          for (regsi._0_4_ = 0; (uint)regsi < _elemsbytes->array_register_count;
              regsi._0_4_ = (uint)regsi + 1) {
            cpy_1 = (int)pfVar3[_elemsbytes->array_registers[(int)(uint)regsi] + cpy_1];
          }
          src[(long)isscalar + -1][3] = (double)cpy_1;
          _cpy = pfVar3;
        }
        break;
      case 1:
        if (i_1 == 0) {
          for (final._4_4_ = 0; final._4_4_ < isscalarop; final._4_4_ = final._4_4_ + 1) {
            src[(long)isscalar + -1][(long)final._4_4_ + 3] =
                 (double)outregs[regsi._4_4_ + final._4_4_];
          }
        }
        else {
          src[(long)isscalar + -1][3] = (double)outregs[regsi._4_4_];
        }
        break;
      case 2:
        if (i_1 == 0) {
          if (preshader->literal_count < regsi._4_4_ + isscalarop) {
            *(undefined8 *)(__s + -8) = 0x130be7;
            __assert_fail("(index + elems) <= preshader->literal_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                          ,0x40,
                          "void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
          }
          lVar6 = (long)isscalar;
          pdVar4 = preshader->literals;
          uVar5 = (ulong)regsi._4_4_;
          sVar7 = (size_t)opiter;
          *(undefined8 *)(__s + -8) = 0x130c1d;
          memcpy(src[lVar6 + -1] + 3,pdVar4 + uVar5,sVar7);
        }
        else {
          for (index = 0; (int)index < isscalarop; index = index + 1) {
            src[(long)isscalar + -1][(long)(int)index + 3] = preshader->literals[regsi._4_4_];
          }
        }
        break;
      case 3:
        if (local_30 != (undefined1 *)0x0) {
          if (i_1 == 0) {
            lVar6 = (long)isscalar;
            uVar5 = (ulong)regsi._4_4_;
            sVar7 = (size_t)opiter;
            *(undefined8 *)(__s + -8) = 0x130eff;
            memcpy(src[lVar6 + -1] + 3,local_30 + uVar5 * 8,sVar7);
          }
          else {
            src[(long)isscalar + -1][3] = *(double *)(local_30 + (ulong)regsi._4_4_ * 8);
          }
        }
        break;
      default:
        *(undefined8 *)(__s + -8) = 0x130f22;
        __assert_fail("0 && \"unexpected preshader operand type.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x77,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      _elemsbytes = _elemsbytes + 1;
    }
    local_140 = (ulong)(pMStack_d8->opcode - MOJOSHADER_PRESHADEROP_MOV);
    switch(local_140) {
    case 0:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = src1[final._0_4_];
      }
      break;
    case 1:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = -src1[final._0_4_];
      }
      break;
    case 2:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = 1.0 / src1[final._0_4_];
      }
      break;
    case 3:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        local_148 = src1[final._0_4_];
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x1310d2;
        dVar8 = floor(dVar8);
        dst[(long)final._0_4_ + -1] = local_148 - dVar8;
      }
      break;
    case 4:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x131134;
        dVar8 = exp(dVar8);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 5:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x131187;
        dVar8 = log(dVar8);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 6:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x1311da;
        dVar8 = sqrt(dVar8);
        dst[(long)final._0_4_ + -1] = 1.0 / dVar8;
      }
      break;
    case 7:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x13123c;
        dVar8 = sin(dVar8);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 8:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x13128f;
        dVar8 = cos(dVar8);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 9:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x1312e2;
        dVar8 = asin(dVar8);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 10:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x131335;
        dVar8 = acos(dVar8);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 0xb:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x131388;
        dVar8 = atan(dVar8);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 0xc:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        if (src2[final._0_4_] <= src1[final._0_4_]) {
          local_150 = src2[final._0_4_];
        }
        else {
          local_150 = src1[final._0_4_];
        }
        dst[(long)final._0_4_ + -1] = local_150;
      }
      break;
    case 0xd:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        if (src1[final._0_4_] < src2[final._0_4_] || src1[final._0_4_] == src2[final._0_4_]) {
          local_158 = src2[final._0_4_];
        }
        else {
          local_158 = src1[final._0_4_];
        }
        dst[(long)final._0_4_ + -1] = local_158;
      }
      break;
    case 0xe:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] =
             (double)((ulong)((uint)(-(ulong)(src1[final._0_4_] < src2[final._0_4_]) >> 0x20) &
                             0x3ff00000) << 0x20);
      }
      break;
    case 0xf:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] =
             (double)((ulong)((uint)(-(ulong)(src2[final._0_4_] <= src1[final._0_4_]) >> 0x20) &
                             0x3ff00000) << 0x20);
      }
      break;
    case 0x10:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = src1[final._0_4_] + src2[final._0_4_];
      }
      break;
    case 0x11:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = src1[final._0_4_] * src2[final._0_4_];
      }
      break;
    case 0x12:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = src1[final._0_4_];
        dVar1 = src2[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x131708;
        dVar8 = atan2(dVar8,dVar1);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 0x13:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = src1[final._0_4_] / src2[final._0_4_];
      }
      break;
    case 0x14:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        if (src1[final._0_4_] < 0.0) {
          local_160 = *(double *)((long)inst->operands + (long)final._0_4_ * 8 + -0x10);
        }
        else {
          local_160 = src2[final._0_4_];
        }
        dst[(long)final._0_4_ + -1] = local_160;
      }
      break;
    default:
      *(undefined8 *)(__s + -8) = 0x131c80;
      __assert_fail("0 && \"Unhandled preshader opcode!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0xb4,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
    case 0x16:
      local_128 = 0.0;
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        local_128 = src1[final._0_4_] * src2[final._0_4_] + local_128;
      }
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = local_128;
      }
      break;
    case 0x18:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        if (src2[final._0_4_] <= *src1) {
          local_168 = src2[final._0_4_];
        }
        else {
          local_168 = *src1;
        }
        dst[(long)final._0_4_ + -1] = local_168;
      }
      break;
    case 0x19:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        if (*src1 < src2[final._0_4_] || *src1 == src2[final._0_4_]) {
          local_170 = src2[final._0_4_];
        }
        else {
          local_170 = *src1;
        }
        dst[(long)final._0_4_ + -1] = local_170;
      }
      break;
    case 0x1a:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] =
             (double)((ulong)((uint)(-(ulong)(*src1 < src2[final._0_4_]) >> 0x20) & 0x3ff00000) <<
                     0x20);
      }
      break;
    case 0x1b:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] =
             (double)((ulong)((uint)(-(ulong)(src2[final._0_4_] <= *src1) >> 0x20) & 0x3ff00000) <<
                     0x20);
      }
      break;
    case 0x1c:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = *src1 + src2[final._0_4_];
      }
      break;
    case 0x1d:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = *src1 * src2[final._0_4_];
      }
      break;
    case 0x1e:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dVar8 = *src1;
        dVar1 = src2[final._0_4_];
        *(undefined8 *)(__s + -8) = 0x131b33;
        dVar8 = atan2(dVar8,dVar1);
        dst[(long)final._0_4_ + -1] = dVar8;
      }
      break;
    case 0x1f:
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        dst[(long)final._0_4_ + -1] = *src1 / src2[final._0_4_];
      }
    }
    if (_elemsbytes->type == MOJOSHADER_PRESHADEROPERAND_TEMP) {
      if ((ulong)preshader->temp_count < (ulong)_elemsbytes->index + ((ulong)(long)opiter >> 3)) {
        *(undefined8 *)(__s + -8) = 0x131cd1;
        __assert_fail("preshader->temp_count >= operand->index + (elemsbytes / sizeof (double))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0xbc,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      uVar2 = _elemsbytes->index;
      sVar7 = (size_t)opiter;
      *(undefined8 *)(__s + -8) = 0x131cf6;
      memcpy(local_30 + (ulong)uVar2 * 8,src[2] + 3,sVar7);
    }
    else {
      if (_elemsbytes->type != MOJOSHADER_PRESHADEROPERAND_OUTPUT) {
        *(undefined8 *)(__s + -8) = 0x131d28;
        __assert_fail("operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0xc1,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      for (final._0_4_ = 0; final._0_4_ < isscalarop; final._0_4_ = final._0_4_ + 1) {
        outregs[_elemsbytes->index + final._0_4_] = (float)dst[(long)final._0_4_ + -1];
      }
    }
    operand._4_4_ = operand._4_4_ + 1;
    pMStack_d8 = pMStack_d8 + 1;
  }
  *(undefined8 *)(__s + -8) = 0x130ae6;
  __assert_fail("elems >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                ,0x31,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
}

Assistant:

void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *preshader,
                             float *outregs)
{
    const float *inregs = preshader->registers;

    // this is fairly straightforward, as there aren't any branching
    //  opcodes in the preshader instruction set (at the moment, at least).
    const int scalarstart = (int) MOJOSHADER_PRESHADEROP_SCALAR_OPS;

    double *temps = NULL;
    if (preshader->temp_count > 0)
    {
        temps = (double *) alloca(sizeof (double) * preshader->temp_count);
        memset(temps, '\0', sizeof (double) * preshader->temp_count);
    } // if

    double dst[4] = { 0, 0, 0, 0 };
    double src[3][4] = { { 0, 0, 0, 0 }, { 0, 0, 0, 0 }, { 0, 0, 0, 0 } };
    const double *src0 = &src[0][0];
    const double *src1 = &src[1][0];
    const double *src2 = &src[2][0];

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    int instit;

    for (instit = 0; instit < preshader->instruction_count; instit++, inst++)
    {
        const MOJOSHADER_preshaderOperand *operand = inst->operands;
        const int elems = inst->element_count;
        const int elemsbytes = sizeof (double) * elems;
        const int isscalarop = (inst->opcode >= scalarstart);

        assert(elems >= 0);
        assert(elems <= 4);

        // load up our operands...
        int opiter, elemiter;
        for (opiter = 0; opiter < inst->operand_count-1; opiter++, operand++)
        {
            const int isscalar = ((isscalarop) && (opiter == 0));
            const unsigned int index = operand->index;
            switch (operand->type)
            {
                case MOJOSHADER_PRESHADEROPERAND_LITERAL:
                {
                    if (!isscalar)
                    {
                        assert((index + elems) <= preshader->literal_count);
                        memcpy(&src[opiter][0], &preshader->literals[index], elemsbytes);
                    } // if
                    else
                    {
                        for (elemiter = 0; elemiter < elems; elemiter++)
                            src[opiter][elemiter] = preshader->literals[index];
                    } // else
                    break;
                } // case

                case MOJOSHADER_PRESHADEROPERAND_INPUT:
                    if (operand->array_register_count > 0)
                    {
                        int i;
                        const int *regsi = (const int *) inregs;
                        int arrIndex = regsi[((index >> 4) * 4) + ((index >> 2) & 3)];
                        for (i = 0; i < operand->array_register_count; i++)
                        {
                            arrIndex = regsi[operand->array_registers[i] + arrIndex];
                        }
                        src[opiter][0] = arrIndex;
                    } // if
                    else if (isscalar)
                        src[opiter][0] = inregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = inregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_OUTPUT:
                    if (isscalar)
                        src[opiter][0] = outregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = outregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_TEMP:
                    if (temps != NULL)
                    {
                        if (isscalar)
                            src[opiter][0] = temps[index];
                        else
                            memcpy(src[opiter], temps + index, elemsbytes);
                    } // if
                    break;

                default:
                    assert(0 && "unexpected preshader operand type.");
                    return;
            } // switch
        } // for

        // run the actual instruction, store result to dst.
        int i;
        switch (inst->opcode)
        {
            #define OPCODE_CASE(op, val) \
                case MOJOSHADER_PRESHADEROP_##op: \
                    for (i = 0; i < elems; i++) { dst[i] = val; } \
                    break;

            //OPCODE_CASE(NOP, 0.0)  // not a real instruction.
            OPCODE_CASE(MOV, src0[i])
            OPCODE_CASE(NEG, -src0[i])
            OPCODE_CASE(RCP, 1.0 / src0[i])
            OPCODE_CASE(FRC, src0[i] - floor(src0[i]))
            OPCODE_CASE(EXP, exp(src0[i]))
            OPCODE_CASE(LOG, log(src0[i]))
            OPCODE_CASE(RSQ, 1.0 / sqrt(src0[i]))
            OPCODE_CASE(SIN, sin(src0[i]))
            OPCODE_CASE(COS, cos(src0[i]))
            OPCODE_CASE(ASIN, asin(src0[i]))
            OPCODE_CASE(ACOS, acos(src0[i]))
            OPCODE_CASE(ATAN, atan(src0[i]))
            OPCODE_CASE(MIN, (src0[i] < src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(MAX, (src0[i] > src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(LT, (src0[i] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE, (src0[i] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD, src0[i] + src1[i])
            OPCODE_CASE(MUL,  src0[i] * src1[i])
            OPCODE_CASE(ATAN2, atan2(src0[i], src1[i]))
            OPCODE_CASE(DIV, src0[i] / src1[i])
            OPCODE_CASE(CMP, (src0[i] >= 0.0) ? src1[i] : src2[i])
            //OPCODE_CASE(NOISE, ???)  // !!! FIXME: don't know what this does
            //OPCODE_CASE(MOVC, ???)  // !!! FIXME: don't know what this does
            OPCODE_CASE(MIN_SCALAR, (src0[0] < src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(MAX_SCALAR, (src0[0] > src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(LT_SCALAR, (src0[0] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE_SCALAR, (src0[0] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD_SCALAR, src0[0] + src1[i])
            OPCODE_CASE(MUL_SCALAR, src0[0] * src1[i])
            OPCODE_CASE(ATAN2_SCALAR, atan2(src0[0], src1[i]))
            OPCODE_CASE(DIV_SCALAR, src0[0] / src1[i])
            //OPCODE_CASE(DOT_SCALAR)  // !!! FIXME: isn't this just a MUL?
            //OPCODE_CASE(NOISE_SCALAR, ???)  // !!! FIXME: ?
            #undef OPCODE_CASE

            case MOJOSHADER_PRESHADEROP_DOT:
            {
                double final = 0.0;
                for (i = 0; i < elems; i++)
                    final += src0[i] * src1[i];
                for (i = 0; i < elems; i++)
                    dst[i] = final;  // !!! FIXME: is this right?
                break;
            } // case

            default:
                assert(0 && "Unhandled preshader opcode!");
                break;
        } // switch

        // Figure out where dst wants to be stored.
        if (operand->type == MOJOSHADER_PRESHADEROPERAND_TEMP)
        {
            assert(preshader->temp_count >=
                    operand->index + (elemsbytes / sizeof (double)));
            memcpy(temps + operand->index, dst, elemsbytes);
        } // if
        else
        {
            assert(operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT);
            for (i = 0; i < elems; i++)
                outregs[operand->index + i] = (float) dst[i];
        } // else
    } // for
}